

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsatBQueue.h
# Opt level: O2

void xSAT_BQueuePush(xSAT_BQueue_t *p,uint Value)

{
  int iVar1;
  int iVar2;
  long lVar3;
  uint *puVar4;
  word wVar5;
  
  iVar2 = p->nSize;
  if (iVar2 == p->nCap) {
    iVar1 = p->iFirst;
    lVar3 = (long)iVar1;
    if (iVar1 != p->iEmpty) {
      __assert_fail("p->iFirst == p->iEmpty",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/xsat/xsatBQueue.h"
                    ,99,"void xSAT_BQueuePush(xSAT_BQueue_t *, unsigned int)");
    }
    puVar4 = p->pData;
    wVar5 = p->nSum - (ulong)puVar4[lVar3];
    p->iFirst = (iVar1 + 1) % iVar2;
  }
  else {
    p->nSize = iVar2 + 1;
    wVar5 = p->nSum;
    puVar4 = p->pData;
    lVar3 = (long)p->iEmpty;
  }
  p->nSum = Value + wVar5;
  puVar4[lVar3] = Value;
  iVar2 = p->iEmpty + 1;
  p->iEmpty = iVar2;
  if (iVar2 == p->nCap) {
    p->iFirst = 0;
    p->iEmpty = 0;
  }
  return;
}

Assistant:

static inline void xSAT_BQueuePush( xSAT_BQueue_t * p, unsigned Value )
{
    if ( p->nSize == p->nCap )
    {
        assert(p->iFirst == p->iEmpty);
        p->nSum -= p->pData[p->iFirst];
        p->iFirst = ( p->iFirst + 1 ) % p->nCap;
    }
    else
        p->nSize++;

    p->nSum += Value;
    p->pData[p->iEmpty] = Value;
    if ( ( ++p->iEmpty ) == p->nCap )
    {
        p->iEmpty = 0;
        p->iFirst = 0;
    }
}